

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char ** readdir_raw(char *dir,int return_subdirs,char *mask)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  DIR *__dirp;
  dirent *pdVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  char **results;
  char buffer [4096];
  char buffer_1 [4096];
  char with_slash [4096];
  char **local_3048;
  undefined8 local_3040;
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  local_3048 = (char **)0x0;
  pcVar8 = local_3038;
  local_3040 = mask;
  sVar5 = stb_strscpy(pcVar8,dir,0x1000);
  if (sVar5 - 0x1000 < 0xfffffffffffff001) {
    return (char **)0x0;
  }
  do {
    if (*pcVar8 == '\\') {
      *pcVar8 = '/';
    }
    else if (*pcVar8 == '\0') break;
    pcVar8 = pcVar8 + 1;
  } while( true );
  sVar6 = sVar5 - 1;
  if (sVar6 == 0) {
    sVar6 = 0;
  }
  else if (local_3038[sVar5 - 2] != '/') {
    local_3038[sVar5 - 1] = '/';
    sVar6 = sVar5;
  }
  local_3038[sVar6] = '\0';
  sVar5 = stb_strscpy(local_1038,local_3038,0x1000);
  if (sVar5 == 0) {
    return (char **)0x0;
  }
  __dirp = opendir(dir);
  if (__dirp == (DIR *)0x0) {
    return local_3048;
  }
  pdVar7 = readdir(__dirp);
  if (pdVar7 != (dirent *)0x0) {
    do {
      pcVar8 = pdVar7->d_name;
      sVar5 = stb_strscpy(local_3038 + sVar6,pcVar8,0x1000 - sVar6);
      if (sVar5 == 0) {
        bVar2 = true;
      }
      else {
        uVar3 = pdVar7->d_type & 4;
        if (uVar3 >> 2 == return_subdirs) {
          if (((char)uVar3 != '\0') && (*pcVar8 == '.')) {
            cVar1 = pdVar7->d_name[1];
            if (cVar1 == '.') {
              cVar1 = pdVar7->d_name[2];
            }
            if (cVar1 == '\0') goto LAB_00187f9e;
          }
          if ((local_3040 == (char *)0x0) ||
             (iVar4 = stb__wildmatch_raw(local_3040,pcVar8,0,1), -1 < iVar4)) {
            iVar4 = stb_snprintf(local_2038,0x1000,"%s%s",local_1038,pcVar8);
            if (iVar4 < 0) {
              bVar2 = true;
            }
            else {
              pcVar8 = strdup(local_2038 + (ulong)(local_2038[1] == '/' && local_2038[0] == '.') * 2
                             );
              if (local_3048 == (char **)0x0) {
                iVar9 = 1;
                iVar11 = 0;
              }
              else {
                iVar9 = *(int *)(local_3048 + -2) + 1;
                iVar11 = *(int *)((long)local_3048 + -0xc);
              }
              if (iVar11 < iVar9) {
                stb__arr_addlen_(&local_3048,8,1);
              }
              else {
                *(int *)(local_3048 + -2) = *(int *)(local_3048 + -2) + 1;
              }
              if (local_3048 == (char **)0x0) {
                lVar10 = 0;
              }
              else {
                lVar10 = (long)*(int *)(local_3048 + -2);
              }
              local_3048[lVar10 + -1] = pcVar8;
              bVar2 = false;
            }
            if (iVar4 < 0) goto LAB_00187fa0;
          }
        }
LAB_00187f9e:
        bVar2 = false;
      }
LAB_00187fa0:
    } while ((!bVar2) && (pdVar7 = readdir(__dirp), pdVar7 != (dirent *)0x0));
  }
  closedir(__dirp);
  return local_3048;
}

Assistant:

static char **readdir_raw(char *dir, int return_subdirs, char *mask)
{
   char **results = NULL;
   char buffer[4096], with_slash[4096];
   size_t n;

   #ifdef _MSC_VER
      stb__wchar *ws;
      struct _wfinddata_t data;
   #ifdef _WIN64
      const intptr_t none = -1;
      intptr_t z;
   #else
      const long none = -1;
      long z;
   #endif
   #else // !_MSC_VER
      const DIR *none = NULL;
      DIR *z;
   #endif

   n = stb_strscpy(buffer,dir,sizeof(buffer));
   if (!n || n >= sizeof(buffer))
      return NULL;
   stb_fixpath(buffer);
   n--;

   if (n > 0 && (buffer[n-1] != '/')) {
      buffer[n++] = '/';
   }
   buffer[n] = 0;
   if (!stb_strscpy(with_slash,buffer,sizeof(with_slash)))
      return NULL;

   #ifdef _MSC_VER
      if (!stb_strscpy(buffer+n,"*.*",sizeof(buffer)-n))
         return NULL;
      ws = stb__from_utf8(buffer);
      z = _wfindfirst((const wchar_t *)ws, &data);
   #else
      z = opendir(dir);
   #endif

   if (z != none) {
      int nonempty = STB_TRUE;
      #ifndef _MSC_VER
      struct dirent *data = readdir(z);
      nonempty = (data != NULL);
      #endif

      if (nonempty) {

         do {
            int is_subdir;
            #ifdef _MSC_VER
            char *name = stb__to_utf8((stb__wchar *)data.name);
            if (name == NULL) {
               fprintf(stderr, "%s to convert '%S' to %s!\n", "Unable", data.name, "utf8");
               continue;
            }
            is_subdir = !!(data.attrib & _A_SUBDIR);
            #else
            char *name = data->d_name;
            if (!stb_strscpy(buffer+n,name,sizeof(buffer)-n))
               break;
            // Could follow DT_LNK, but would need to check for recursive links.
            is_subdir = !!(data->d_type & DT_DIR);
            #endif

            if (is_subdir == return_subdirs) {
               if (!is_subdir || !isdotdirname(name)) {
                  if (!mask || stb_wildmatchi(mask, name)) {
                     char buffer[4096],*p=buffer;
                     if ( stb_snprintf(buffer, sizeof(buffer), "%s%s", with_slash, name) < 0 )
                        break;
                     if (buffer[0] == '.' && buffer[1] == '/')
                        p = buffer+2;
                     stb_arr_push(results, strdup(p));
                  }
               }
            }
         }
         #ifdef _MSC_VER
         while (0 == _wfindnext(z, &data));
         #else
         while ((data = readdir(z)) != NULL);
         #endif
      }
      #ifdef _MSC_VER
         _findclose(z);
      #else
         closedir(z);
      #endif
   }
   return results;
}